

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HopcroftKarpAlgorithm.cpp
# Opt level: O2

int16_t __thiscall BoxNesting::HopcroftKarpAlgorithm::runAlgorithm(HopcroftKarpAlgorithm *this)

{
  bool bVar1;
  int16_t iVar2;
  int16_t i;
  short vertex;
  value_type_conflict4 local_4c;
  allocator_type local_49;
  _Vector_base<short,_std::allocator<short>_> local_48;
  
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_48,(long)this->leftVerticesCount + 1,
             &NILL,(allocator_type *)&local_4c);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->pairsLeft,&local_48);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_48);
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_48,(long)this->rightVerticesCount + 1,
             &NILL,(allocator_type *)&local_4c);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->pairsRight,&local_48);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_48);
  local_4c = 0;
  std::vector<short,_std::allocator<short>_>::vector
            ((vector<short,_std::allocator<short>_> *)&local_48,(long)this->leftVerticesCount + 1,
             &local_4c,&local_49);
  std::vector<short,_std::allocator<short>_>::_M_move_assign(&this->distances,&local_48);
  std::_Vector_base<short,_std::allocator<short>_>::~_Vector_base(&local_48);
  iVar2 = this->leftVerticesCount;
  while( true ) {
    bVar1 = bfs(this);
    if (!bVar1) break;
    for (vertex = 1; vertex <= this->leftVerticesCount; vertex = vertex + 1) {
      if ((this->pairsLeft).super__Vector_base<short,_std::allocator<short>_>._M_impl.
          super__Vector_impl_data._M_start[vertex] == 0) {
        bVar1 = dfs(this,vertex);
        iVar2 = iVar2 - (ushort)bVar1;
      }
    }
  }
  return iVar2;
}

Assistant:

int16_t HopcroftKarpAlgorithm::runAlgorithm() const
{
	this->pairsLeft = std::vector<int16_t>(this->leftVerticesCount + 1, NILL);
	this->pairsRight = std::vector<int16_t>(this->rightVerticesCount + 1, NILL);
	this->distances = std::vector<int16_t>(this->leftVerticesCount + 1, 0);

	// We have the same amount of visible boxes as there
	// are vertices in the left partition
	// for each valid match (i.e. a box can nest inside another box)
	// we remove a visible box
	int16_t visibleBoxes = this->leftVerticesCount;

	while (bfs()) 
	{ 
		// Find a free vertex 
		for (int16_t i = 1; i <= leftVerticesCount; ++i)
		{
			if (pairsLeft[i] == NILL && this->dfs(i))
			{
				--visibleBoxes;
			}
		}
	}

	return visibleBoxes;
}